

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_function.hpp
# Opt level: O3

object __thiscall
boost::python::detail::
make_function_aux<int(MlmWrap::*)(HighFreqDataType),boost::python::default_call_policies,boost::mpl::vector3<int,AbstractModuleClient&,HighFreqDataType>,mpl_::int_<0>>
          (detail *this,long f,long p,undefined8 param_4,undefined8 param_5,pair *param_6)

{
  pointer *__ptr;
  py_function local_28;
  
  local_28.m_impl._M_t.
  super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
  .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl =
       (unique_ptr<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
        )operator_new(0x18);
  *(undefined ***)
   local_28.m_impl._M_t.
   super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
   .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl =
       &PTR__py_function_impl_base_003ee9f0;
  *(long *)((long)local_28.m_impl._M_t.
                  super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                  .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>.
                  _M_head_impl + 8) = f;
  *(long *)((long)local_28.m_impl._M_t.
                  super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                  .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>.
                  _M_head_impl + 0x10) = p;
  objects::function_object((objects *)this,&local_28,param_6);
  if (local_28.m_impl._M_t.
      super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
      .super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_28.m_impl._M_t.
                          super___uniq_ptr_impl<boost::python::objects::py_function_impl_base,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_boost::python::objects::py_function_impl_base_*,_std::default_delete<boost::python::objects::py_function_impl_base>_>
                          .
                          super__Head_base<0UL,_boost::python::objects::py_function_impl_base_*,_false>
                          ._M_head_impl + 8))();
  }
  return (object)(object_base)this;
}

Assistant:

object make_function_aux(
      F f
      , CallPolicies const& p
      , Sig const&
      , detail::keyword_range const& kw // a [begin,end) pair of iterators over keyword names
      , NumKeywords                     // An MPL integral type wrapper: the size of kw
      )
  {
      enum { arity = mpl::size<Sig>::value - 1 };
      
      typedef typename detail::error::more_keywords_than_function_arguments<
          NumKeywords::value, arity
          >::too_many_keywords assertion BOOST_ATTRIBUTE_UNUSED;
    
      return objects::function_object(
          detail::caller<F,CallPolicies,Sig>(f, p)
        , kw);
  }